

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  InternalMetadata *this_00;
  float fVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar4 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar5 & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_001e8ad1;
  }
  else if (((ulong)pvVar4 & 1) == 0) {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (&(other->super_MessageLite)._internal_metadata_);
    pvVar5 = this_00->ptr_;
  }
  if (((ulong)pvVar5 & 1) == 0) {
    pbVar6 = google::protobuf::internal::InternalMetadata::
             mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)pvVar5 & 0xfffffffffffffffe) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar6);
LAB_001e8ad1:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar4 = (this->piece_).tagged_ptr_.ptr_;
  (this->piece_).tagged_ptr_.ptr_ = (other->piece_).tagged_ptr_.ptr_;
  (other->piece_).tagged_ptr_.ptr_ = pvVar4;
  fVar1 = this->score_;
  this->score_ = other->score_;
  other->score_ = fVar1;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}